

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_257,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  undefined4 uVar18;
  ulong unaff_R15;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  uint uVar23;
  float fVar40;
  float fVar43;
  vint4 ai;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar41;
  uint uVar42;
  float fVar44;
  uint uVar45;
  float fVar46;
  uint uVar47;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_2;
  float fVar48;
  uint uVar49;
  float fVar50;
  float fVar53;
  float fVar56;
  vint4 ai_1;
  uint uVar54;
  float fVar55;
  uint uVar57;
  float fVar58;
  float fVar59;
  uint uVar60;
  float fVar61;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar62;
  float fVar66;
  float fVar67;
  vfloat4 a0;
  undefined1 auVar63 [16];
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  uint uVar70;
  float fVar71;
  float fVar74;
  float fVar77;
  vint4 ai_3;
  uint uVar75;
  float fVar76;
  uint uVar78;
  float fVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar93;
  float fVar94;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  vint4 bi_7;
  undefined1 auVar98 [16];
  float fVar102;
  undefined1 auVar99 [16];
  vint4 bi_4;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  vfloat<4> tNear;
  vint4 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1098 [16];
  ulong local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar24 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar63 = rsqrtss(auVar24,auVar24);
    fVar20 = auVar63._0_4_;
    local_fb8[0] = fVar20 * 1.5 - fVar20 * fVar20 * auVar24._0_4_ * 0.5 * fVar20;
    auVar85._0_4_ = local_fe8 * local_fb8[0];
    auVar85._4_4_ = local_ff8 * local_fb8[0];
    auVar85._8_4_ = local_fd8 * local_fb8[0];
    auVar85._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar15 = CONCAT44(auVar85._4_4_,auVar85._4_4_);
    auVar25._0_8_ = uVar15 ^ 0x8000000080000000;
    auVar25._8_4_ = -auVar85._12_4_;
    auVar25._12_4_ = -auVar85._12_4_;
    auVar92._0_12_ = ZEXT812(0);
    auVar92._12_4_ = 0;
    auVar25 = blendps(auVar25,auVar92,0xe);
    auVar24._4_4_ = auVar25._0_4_;
    auVar24._0_4_ = auVar85._8_4_;
    auVar24._8_4_ = auVar25._4_4_;
    auVar24._12_4_ = 0;
    auVar63._4_4_ = auVar25._0_4_;
    auVar63._0_4_ = auVar85._8_4_;
    auVar63._8_4_ = auVar25._4_4_;
    auVar63._12_4_ = 0;
    auVar96 = dpps(auVar63 << 0x20,auVar24 << 0x20,0x7f);
    uVar15 = CONCAT44(auVar85._12_4_,auVar85._8_4_);
    auVar87._0_8_ = uVar15 ^ 0x8000000080000000;
    auVar87._8_4_ = -auVar85._8_4_;
    auVar87._12_4_ = -auVar85._12_4_;
    auVar25 = insertps(auVar87,auVar85,0x2a);
    auVar63 = dpps(auVar25,auVar25,0x7f);
    iVar19 = -(uint)(auVar63._0_4_ < auVar96._0_4_);
    auVar96._4_4_ = iVar19;
    auVar96._0_4_ = iVar19;
    auVar96._8_4_ = iVar19;
    auVar96._12_4_ = iVar19;
    auVar24 = blendvps(auVar25,auVar24 << 0x20,auVar96);
    auVar63 = dpps(auVar24,auVar24,0x7f);
    auVar25 = rsqrtss(auVar63,auVar63);
    fVar20 = auVar25._0_4_;
    fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * auVar63._0_4_ * 0.5 * fVar20;
    fVar21 = fVar20 * auVar24._0_4_;
    fVar40 = fVar20 * auVar24._4_4_;
    fVar43 = fVar20 * auVar24._8_4_;
    fVar20 = fVar20 * auVar24._12_4_;
    fVar86 = fVar40 * auVar85._0_4_ - auVar85._4_4_ * fVar21;
    fVar93 = fVar43 * auVar85._4_4_ - auVar85._8_4_ * fVar40;
    fVar94 = fVar21 * auVar85._8_4_ - auVar85._0_4_ * fVar43;
    auVar88._12_4_ = fVar20 * auVar85._12_4_ - auVar85._12_4_ * fVar20;
    auVar88._0_8_ = CONCAT44(fVar94,fVar93);
    auVar88._8_4_ = fVar86;
    auVar95._8_4_ = fVar86;
    auVar95._0_8_ = auVar88._0_8_;
    auVar95._12_4_ = auVar88._12_4_;
    auVar24 = dpps(auVar95,auVar88,0x7f);
    auVar63 = rsqrtss(auVar24,auVar24);
    fVar20 = auVar63._0_4_;
    fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * auVar24._0_4_ * 0.5 * fVar20;
    local_f88._4_4_ = fVar20 * fVar86;
    local_f88._0_4_ = fVar43;
    local_f88._8_4_ = auVar85._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar20 * fVar94;
    local_f98._0_4_ = fVar40;
    local_f98._8_4_ = auVar85._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar20 * fVar93;
    local_fa8._0_4_ = fVar21;
    local_fa8._8_4_ = auVar85._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar17 = (undefined1 (*) [16])local_f68;
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar20 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar21 = 0.0;
      if (0.0 <= fVar20) {
        fVar21 = fVar20;
      }
      fVar20 = (ray->super_RayK<1>).tfar;
      fVar40 = 0.0;
      if (0.0 <= fVar20) {
        fVar40 = fVar20;
      }
      auVar26._4_4_ = -(uint)(ABS(local_ff8) < DAT_01ff1d40._4_4_);
      auVar26._0_4_ = -(uint)(ABS(local_fe8) < (float)DAT_01ff1d40);
      auVar26._8_4_ = -(uint)(ABS(local_fd8) < DAT_01ff1d40._8_4_);
      auVar26._12_4_ = -(uint)(ABS(aVar2.field_3.w) < DAT_01ff1d40._12_4_);
      auVar63 = blendvps((undefined1  [16])aVar2,_DAT_01ff1d40,auVar26);
      auVar24 = rcpps(auVar26,auVar63);
      local_1058 = auVar24._0_4_;
      local_1068 = auVar24._4_4_;
      local_1028 = auVar24._8_4_;
      local_1058 = (1.0 - auVar63._0_4_ * local_1058) * local_1058 + local_1058;
      local_1068 = (1.0 - auVar63._4_4_ * local_1068) * local_1068 + local_1068;
      local_1028 = (1.0 - auVar63._8_4_ * local_1028) * local_1028 + local_1028;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      uVar16 = (ulong)(local_1058 < 0.0) * 0x10;
      uVar12 = (ulong)(local_1068 < 0.0) << 4 | 0x20;
      uVar14 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
      local_1018._4_4_ = fVar21;
      local_1018._0_4_ = fVar21;
      local_1018._8_4_ = fVar21;
      local_1018._12_4_ = fVar21;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      local_1080 = uVar14;
      uVar15 = uVar14;
      fVar20 = fVar40;
      fVar21 = fVar40;
      fVar43 = fVar40;
      auVar24 = local_1018;
      fVar86 = local_1058;
      fVar93 = local_1058;
      fVar94 = local_1058;
      fVar106 = local_1058;
      fVar50 = local_1028;
      fVar55 = local_1028;
      fVar58 = local_1028;
      fVar61 = local_1028;
      fVar107 = local_fc8;
      fVar108 = local_fc8;
      fVar109 = local_fc8;
      fVar110 = local_fc8;
      fVar62 = local_1038;
      fVar66 = local_1038;
      fVar67 = local_1038;
      fVar68 = local_1038;
      fVar71 = local_1048;
      fVar76 = local_1048;
      fVar79 = local_1048;
      fVar82 = local_1048;
      fVar97 = local_1068;
      fVar100 = local_1068;
      fVar101 = local_1068;
      fVar102 = local_1068;
      do {
        do {
          if (pauVar17 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar8 = pauVar17 + -1;
          pauVar17 = pauVar17 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar8 + 8));
        uVar11 = *(ulong *)*pauVar17;
        do {
          iVar9 = (int)(uVar11 & 0xf);
          iVar19 = auVar24._12_4_;
          if ((uVar11 & 0xf) == 0) {
            pfVar1 = (float *)(uVar11 + 0x20 + uVar16);
            fVar22 = (*pfVar1 - fVar62) * fVar86;
            fVar41 = (pfVar1[1] - fVar66) * fVar93;
            fVar44 = (pfVar1[2] - fVar67) * fVar94;
            fVar46 = (pfVar1[3] - fVar68) * fVar106;
            pfVar1 = (float *)(uVar11 + 0x20 + uVar12);
            fVar48 = (*pfVar1 - fVar71) * fVar97;
            fVar53 = (pfVar1[1] - fVar76) * fVar100;
            fVar56 = (pfVar1[2] - fVar79) * fVar101;
            fVar59 = (pfVar1[3] - fVar82) * fVar102;
            uVar49 = (uint)((int)fVar48 < (int)fVar22) * (int)fVar22 |
                     (uint)((int)fVar48 >= (int)fVar22) * (int)fVar48;
            uVar54 = (uint)((int)fVar53 < (int)fVar41) * (int)fVar41 |
                     (uint)((int)fVar53 >= (int)fVar41) * (int)fVar53;
            uVar57 = (uint)((int)fVar56 < (int)fVar44) * (int)fVar44 |
                     (uint)((int)fVar56 >= (int)fVar44) * (int)fVar56;
            uVar60 = (uint)((int)fVar59 < (int)fVar46) * (int)fVar46 |
                     (uint)((int)fVar59 >= (int)fVar46) * (int)fVar59;
            pfVar1 = (float *)(uVar11 + 0x20 + uVar15);
            fVar22 = (*pfVar1 - fVar107) * fVar50;
            fVar41 = (pfVar1[1] - fVar108) * fVar55;
            fVar44 = (pfVar1[2] - fVar109) * fVar58;
            fVar46 = (pfVar1[3] - fVar110) * fVar61;
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar16 ^ 0x10));
            fVar48 = (*pfVar1 - fVar62) * fVar86;
            fVar53 = (pfVar1[1] - fVar66) * fVar93;
            fVar56 = (pfVar1[2] - fVar67) * fVar94;
            fVar59 = (pfVar1[3] - fVar68) * fVar106;
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar12 ^ 0x10));
            fVar69 = (*pfVar1 - fVar71) * fVar97;
            fVar74 = (pfVar1[1] - fVar76) * fVar100;
            fVar77 = (pfVar1[2] - fVar79) * fVar101;
            fVar80 = (pfVar1[3] - fVar82) * fVar102;
            uVar70 = (uint)((int)fVar48 < (int)fVar69) * (int)fVar48 |
                     (uint)((int)fVar48 >= (int)fVar69) * (int)fVar69;
            uVar75 = (uint)((int)fVar53 < (int)fVar74) * (int)fVar53 |
                     (uint)((int)fVar53 >= (int)fVar74) * (int)fVar74;
            uVar78 = (uint)((int)fVar56 < (int)fVar77) * (int)fVar56 |
                     (uint)((int)fVar56 >= (int)fVar77) * (int)fVar77;
            uVar81 = (uint)((int)fVar59 < (int)fVar80) * (int)fVar59 |
                     (uint)((int)fVar59 >= (int)fVar80) * (int)fVar80;
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar14 ^ 0x10));
            fVar48 = (*pfVar1 - fVar107) * fVar50;
            fVar53 = (pfVar1[1] - fVar108) * fVar55;
            fVar56 = (pfVar1[2] - fVar109) * fVar58;
            fVar59 = (pfVar1[3] - fVar110) * fVar61;
            iVar6 = auVar24._0_4_;
            uVar23 = (uint)((int)fVar22 < iVar6) * iVar6 |
                     (uint)((int)fVar22 >= iVar6) * (int)fVar22;
            iVar6 = auVar24._4_4_;
            uVar42 = (uint)((int)fVar41 < iVar6) * iVar6 |
                     (uint)((int)fVar41 >= iVar6) * (int)fVar41;
            iVar6 = auVar24._8_4_;
            uVar45 = (uint)((int)fVar44 < iVar6) * iVar6 |
                     (uint)((int)fVar44 >= iVar6) * (int)fVar44;
            uVar47 = (uint)((int)fVar46 < iVar19) * iVar19 |
                     (uint)((int)fVar46 >= iVar19) * (int)fVar46;
            local_1098._0_4_ =
                 ((int)uVar23 < (int)uVar49) * uVar49 | ((int)uVar23 >= (int)uVar49) * uVar23;
            local_1098._4_4_ =
                 ((int)uVar42 < (int)uVar54) * uVar54 | ((int)uVar42 >= (int)uVar54) * uVar42;
            local_1098._8_4_ =
                 ((int)uVar45 < (int)uVar57) * uVar57 | ((int)uVar45 >= (int)uVar57) * uVar45;
            local_1098._12_4_ =
                 ((int)uVar47 < (int)uVar60) * uVar60 | ((int)uVar47 >= (int)uVar60) * uVar47;
            uVar23 = (uint)((int)fVar40 < (int)fVar48) * (int)fVar40 |
                     (uint)((int)fVar40 >= (int)fVar48) * (int)fVar48;
            uVar42 = (uint)((int)fVar20 < (int)fVar53) * (int)fVar20 |
                     (uint)((int)fVar20 >= (int)fVar53) * (int)fVar53;
            uVar45 = (uint)((int)fVar21 < (int)fVar56) * (int)fVar21 |
                     (uint)((int)fVar21 >= (int)fVar56) * (int)fVar56;
            uVar47 = (uint)((int)fVar43 < (int)fVar59) * (int)fVar43 |
                     (uint)((int)fVar43 >= (int)fVar59) * (int)fVar59;
            auVar27._0_4_ =
                 -(uint)((int)(((int)uVar70 < (int)uVar23) * uVar70 |
                              ((int)uVar70 >= (int)uVar23) * uVar23) < (int)local_1098._0_4_);
            auVar27._4_4_ =
                 -(uint)((int)(((int)uVar75 < (int)uVar42) * uVar75 |
                              ((int)uVar75 >= (int)uVar42) * uVar42) < (int)local_1098._4_4_);
            auVar27._8_4_ =
                 -(uint)((int)(((int)uVar78 < (int)uVar45) * uVar78 |
                              ((int)uVar78 >= (int)uVar45) * uVar45) < (int)local_1098._8_4_);
            auVar27._12_4_ =
                 -(uint)((int)(((int)uVar81 < (int)uVar47) * uVar81 |
                              ((int)uVar81 >= (int)uVar47) * uVar47) < (int)local_1098._12_4_);
            uVar23 = movmskps(iVar9,auVar27);
            unaff_R15 = ((ulong)uVar23 ^ 0xf) & 0xff;
LAB_00e6ef75:
            bVar7 = true;
          }
          else {
            if (iVar9 == 2) {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              local_1008 = *(float *)(uVar10 + 0x70);
              fStack_1004 = *(float *)(uVar10 + 0x74);
              fStack_1000 = *(float *)(uVar10 + 0x78);
              fStack_ffc = *(float *)(uVar10 + 0x7c);
              auVar98._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x20) +
                   local_ff8 * *(float *)(uVar10 + 0x50) + local_fd8 * *(float *)(uVar10 + 0x80);
              auVar98._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x24) +
                   fStack_ff4 * *(float *)(uVar10 + 0x54) + fStack_fd4 * *(float *)(uVar10 + 0x84);
              auVar98._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x28) +
                   fStack_ff0 * *(float *)(uVar10 + 0x58) + fStack_fd0 * *(float *)(uVar10 + 0x88);
              auVar98._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x2c) +
                   fStack_fec * *(float *)(uVar10 + 0x5c) + fStack_fcc * *(float *)(uVar10 + 0x8c);
              auVar103._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x30) +
                   local_ff8 * *(float *)(uVar10 + 0x60) + local_fd8 * *(float *)(uVar10 + 0x90);
              auVar103._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x34) +
                   fStack_ff4 * *(float *)(uVar10 + 100) + fStack_fd4 * *(float *)(uVar10 + 0x94);
              auVar103._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x38) +
                   fStack_ff0 * *(float *)(uVar10 + 0x68) + fStack_fd0 * *(float *)(uVar10 + 0x98);
              auVar103._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x3c) +
                   fStack_fec * *(float *)(uVar10 + 0x6c) + fStack_fcc * *(float *)(uVar10 + 0x9c);
              auVar105._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x40) +
                   local_ff8 * local_1008 + local_fd8 * *(float *)(uVar10 + 0xa0);
              auVar105._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x44) +
                   fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar10 + 0xa4);
              auVar105._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x48) +
                   fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar10 + 0xa8);
              auVar105._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x4c) +
                   fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar10 + 0xac);
              fVar86 = (float)DAT_01ff1d40;
              fVar93 = DAT_01ff1d40._4_4_;
              fVar94 = DAT_01ff1d40._8_4_;
              fVar106 = DAT_01ff1d40._12_4_;
              auVar28._4_4_ = -(uint)(ABS(auVar98._4_4_) < fVar93);
              auVar28._0_4_ = -(uint)(ABS(auVar98._0_4_) < fVar86);
              auVar28._8_4_ = -(uint)(ABS(auVar98._8_4_) < fVar94);
              auVar28._12_4_ = -(uint)(ABS(auVar98._12_4_) < fVar106);
              auVar24 = blendvps(auVar98,_DAT_01ff1d40,auVar28);
              auVar29._4_4_ = -(uint)(ABS(auVar103._4_4_) < fVar93);
              auVar29._0_4_ = -(uint)(ABS(auVar103._0_4_) < fVar86);
              auVar29._8_4_ = -(uint)(ABS(auVar103._8_4_) < fVar94);
              auVar29._12_4_ = -(uint)(ABS(auVar103._12_4_) < fVar106);
              auVar63 = blendvps(auVar103,_DAT_01ff1d40,auVar29);
              auVar30._4_4_ = -(uint)(ABS(auVar105._4_4_) < fVar93);
              auVar30._0_4_ = -(uint)(ABS(auVar105._0_4_) < fVar86);
              auVar30._8_4_ = -(uint)(ABS(auVar105._8_4_) < fVar94);
              auVar30._12_4_ = -(uint)(ABS(auVar105._12_4_) < fVar106);
              auVar25 = blendvps(auVar105,_DAT_01ff1d40,auVar30);
              auVar96 = rcpps(_DAT_01ff1d40,auVar24);
              fVar86 = auVar96._0_4_;
              fVar93 = auVar96._4_4_;
              fVar94 = auVar96._8_4_;
              fVar106 = auVar96._12_4_;
              fVar86 = (1.0 - auVar24._0_4_ * fVar86) * fVar86 + fVar86;
              fVar93 = (1.0 - auVar24._4_4_ * fVar93) * fVar93 + fVar93;
              fVar94 = (1.0 - auVar24._8_4_ * fVar94) * fVar94 + fVar94;
              fVar106 = (1.0 - auVar24._12_4_ * fVar106) * fVar106 + fVar106;
              auVar24 = rcpps(auVar96,auVar63);
              fVar97 = auVar24._0_4_;
              fVar100 = auVar24._4_4_;
              fVar101 = auVar24._8_4_;
              fVar102 = auVar24._12_4_;
              fVar97 = (1.0 - auVar63._0_4_ * fVar97) * fVar97 + fVar97;
              fVar100 = (1.0 - auVar63._4_4_ * fVar100) * fVar100 + fVar100;
              fVar101 = (1.0 - auVar63._8_4_ * fVar101) * fVar101 + fVar101;
              fVar102 = (1.0 - auVar63._12_4_ * fVar102) * fVar102 + fVar102;
              auVar24 = rcpps(auVar24,auVar25);
              fVar22 = auVar24._0_4_;
              fVar41 = auVar24._4_4_;
              fVar44 = auVar24._8_4_;
              fVar46 = auVar24._12_4_;
              fVar22 = (1.0 - auVar25._0_4_ * fVar22) * fVar22 + fVar22;
              fVar41 = (1.0 - auVar25._4_4_ * fVar41) * fVar41 + fVar41;
              fVar44 = (1.0 - auVar25._8_4_ * fVar44) * fVar44 + fVar44;
              fVar46 = (1.0 - auVar25._12_4_ * fVar46) * fVar46 + fVar46;
              fVar71 = (*(float *)(uVar10 + 0x20) * local_1038 +
                       *(float *)(uVar10 + 0x50) * local_1048 +
                       *(float *)(uVar10 + 0x80) * fVar107 + *(float *)(uVar10 + 0xb0)) * -fVar86;
              fVar76 = (*(float *)(uVar10 + 0x24) * fStack_1034 +
                       *(float *)(uVar10 + 0x54) * fStack_1044 +
                       *(float *)(uVar10 + 0x84) * fVar108 + *(float *)(uVar10 + 0xb4)) * -fVar93;
              fVar79 = (*(float *)(uVar10 + 0x28) * fStack_1030 +
                       *(float *)(uVar10 + 0x58) * fStack_1040 +
                       *(float *)(uVar10 + 0x88) * fVar109 + *(float *)(uVar10 + 0xb8)) * -fVar94;
              fVar82 = (*(float *)(uVar10 + 0x2c) * fStack_102c +
                       *(float *)(uVar10 + 0x5c) * fStack_103c +
                       *(float *)(uVar10 + 0x8c) * fVar110 + *(float *)(uVar10 + 0xbc)) * -fVar106;
              fVar62 = (*(float *)(uVar10 + 0x30) * local_1038 +
                       *(float *)(uVar10 + 0x60) * local_1048 +
                       *(float *)(uVar10 + 0x90) * fVar107 + *(float *)(uVar10 + 0xc0)) * -fVar97;
              fVar66 = (*(float *)(uVar10 + 0x34) * fStack_1034 +
                       *(float *)(uVar10 + 100) * fStack_1044 +
                       *(float *)(uVar10 + 0x94) * fVar108 + *(float *)(uVar10 + 0xc4)) * -fVar100;
              fVar67 = (*(float *)(uVar10 + 0x38) * fStack_1030 +
                       *(float *)(uVar10 + 0x68) * fStack_1040 +
                       *(float *)(uVar10 + 0x98) * fVar109 + *(float *)(uVar10 + 200)) * -fVar101;
              fVar68 = (*(float *)(uVar10 + 0x3c) * fStack_102c +
                       *(float *)(uVar10 + 0x6c) * fStack_103c +
                       *(float *)(uVar10 + 0x9c) * fVar110 + *(float *)(uVar10 + 0xcc)) * -fVar102;
              fVar50 = (*(float *)(uVar10 + 0x40) * local_1038 +
                       local_1008 * local_1048 +
                       *(float *)(uVar10 + 0xa0) * fVar107 + *(float *)(uVar10 + 0xd0)) * -fVar22;
              fVar55 = (*(float *)(uVar10 + 0x44) * fStack_1034 +
                       fStack_1004 * fStack_1044 +
                       *(float *)(uVar10 + 0xa4) * fVar108 + *(float *)(uVar10 + 0xd4)) * -fVar41;
              fVar58 = (*(float *)(uVar10 + 0x48) * fStack_1030 +
                       fStack_1000 * fStack_1040 +
                       *(float *)(uVar10 + 0xa8) * fVar109 + *(float *)(uVar10 + 0xd8)) * -fVar44;
              fVar61 = (*(float *)(uVar10 + 0x4c) * fStack_102c +
                       fStack_ffc * fStack_103c +
                       *(float *)(uVar10 + 0xac) * fVar110 + *(float *)(uVar10 + 0xdc)) * -fVar46;
              fVar86 = fVar86 + fVar71;
              fVar93 = fVar93 + fVar76;
              fVar94 = fVar94 + fVar79;
              fVar106 = fVar106 + fVar82;
              fVar97 = fVar97 + fVar62;
              fVar100 = fVar100 + fVar66;
              fVar101 = fVar101 + fVar67;
              fVar102 = fVar102 + fVar68;
              fVar22 = fVar22 + fVar50;
              fVar41 = fVar41 + fVar55;
              fVar44 = fVar44 + fVar58;
              fVar46 = fVar46 + fVar61;
              auVar83._0_4_ =
                   (uint)((int)fVar97 < (int)fVar62) * (int)fVar97 |
                   (uint)((int)fVar97 >= (int)fVar62) * (int)fVar62;
              auVar83._4_4_ =
                   (uint)((int)fVar100 < (int)fVar66) * (int)fVar100 |
                   (uint)((int)fVar100 >= (int)fVar66) * (int)fVar66;
              auVar83._8_4_ =
                   (uint)((int)fVar101 < (int)fVar67) * (int)fVar101 |
                   (uint)((int)fVar101 >= (int)fVar67) * (int)fVar67;
              auVar83._12_4_ =
                   (uint)((int)fVar102 < (int)fVar68) * (int)fVar102 |
                   (uint)((int)fVar102 >= (int)fVar68) * (int)fVar68;
              auVar89._0_4_ =
                   (uint)((int)fVar22 < (int)fVar50) * (int)fVar22 |
                   (uint)((int)fVar22 >= (int)fVar50) * (int)fVar50;
              auVar89._4_4_ =
                   (uint)((int)fVar41 < (int)fVar55) * (int)fVar41 |
                   (uint)((int)fVar41 >= (int)fVar55) * (int)fVar55;
              auVar89._8_4_ =
                   (uint)((int)fVar44 < (int)fVar58) * (int)fVar44 |
                   (uint)((int)fVar44 >= (int)fVar58) * (int)fVar58;
              auVar89._12_4_ =
                   (uint)((int)fVar46 < (int)fVar61) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar61) * (int)fVar61;
              auVar63 = maxps(auVar83,auVar89);
              auVar90._0_4_ =
                   (uint)((int)fVar86 < (int)fVar71) * (int)fVar86 |
                   (uint)((int)fVar86 >= (int)fVar71) * (int)fVar71;
              auVar90._4_4_ =
                   (uint)((int)fVar93 < (int)fVar76) * (int)fVar93 |
                   (uint)((int)fVar93 >= (int)fVar76) * (int)fVar76;
              auVar90._8_4_ =
                   (uint)((int)fVar94 < (int)fVar79) * (int)fVar94 |
                   (uint)((int)fVar94 >= (int)fVar79) * (int)fVar79;
              auVar90._12_4_ =
                   (uint)((int)fVar106 < (int)fVar82) * (int)fVar106 |
                   (uint)((int)fVar106 >= (int)fVar82) * (int)fVar82;
              auVar31._0_4_ =
                   (uint)((int)fVar86 < (int)fVar71) * (int)fVar71 |
                   (uint)((int)fVar86 >= (int)fVar71) * (int)fVar86;
              auVar31._4_4_ =
                   (uint)((int)fVar93 < (int)fVar76) * (int)fVar76 |
                   (uint)((int)fVar93 >= (int)fVar76) * (int)fVar93;
              auVar31._8_4_ =
                   (uint)((int)fVar94 < (int)fVar79) * (int)fVar79 |
                   (uint)((int)fVar94 >= (int)fVar79) * (int)fVar94;
              auVar31._12_4_ =
                   (uint)((int)fVar106 < (int)fVar82) * (int)fVar82 |
                   (uint)((int)fVar106 >= (int)fVar82) * (int)fVar106;
              auVar99._0_4_ =
                   (uint)((int)fVar97 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar97 >= (int)fVar62) * (int)fVar97;
              auVar99._4_4_ =
                   (uint)((int)fVar100 < (int)fVar66) * (int)fVar66 |
                   (uint)((int)fVar100 >= (int)fVar66) * (int)fVar100;
              auVar99._8_4_ =
                   (uint)((int)fVar101 < (int)fVar67) * (int)fVar67 |
                   (uint)((int)fVar101 >= (int)fVar67) * (int)fVar101;
              auVar99._12_4_ =
                   (uint)((int)fVar102 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar102 >= (int)fVar68) * (int)fVar102;
              auVar104._0_4_ =
                   (uint)((int)fVar22 < (int)fVar50) * (int)fVar50 |
                   (uint)((int)fVar22 >= (int)fVar50) * (int)fVar22;
              auVar104._4_4_ =
                   (uint)((int)fVar41 < (int)fVar55) * (int)fVar55 |
                   (uint)((int)fVar41 >= (int)fVar55) * (int)fVar41;
              auVar104._8_4_ =
                   (uint)((int)fVar44 < (int)fVar58) * (int)fVar58 |
                   (uint)((int)fVar44 >= (int)fVar58) * (int)fVar44;
              auVar104._12_4_ =
                   (uint)((int)fVar46 < (int)fVar61) * (int)fVar61 |
                   (uint)((int)fVar46 >= (int)fVar61) * (int)fVar46;
              auVar25 = minps(auVar99,auVar104);
              auVar24 = maxps(local_1018,auVar90);
              local_1098 = maxps(auVar24,auVar63);
              auVar64._4_4_ = fVar20;
              auVar64._0_4_ = fVar40;
              auVar64._8_4_ = fVar21;
              auVar64._12_4_ = fVar43;
              auVar24 = minps(auVar64,auVar31);
              auVar24 = minps(auVar24,auVar25);
              auVar51._4_4_ = -(uint)(local_1098._4_4_ <= auVar24._4_4_);
              auVar51._0_4_ = -(uint)(local_1098._0_4_ <= auVar24._0_4_);
              auVar51._8_4_ = -(uint)(local_1098._8_4_ <= auVar24._8_4_);
              auVar51._12_4_ = -(uint)(local_1098._12_4_ <= auVar24._12_4_);
              uVar18 = movmskps((int)unaff_R15,auVar51);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar18);
              auVar24 = local_1018;
              fVar86 = local_1058;
              fVar93 = fStack_1054;
              fVar94 = fStack_1050;
              fVar106 = fStack_104c;
              fVar50 = local_1028;
              fVar55 = fStack_1024;
              fVar58 = fStack_1020;
              fVar61 = fStack_101c;
              fVar62 = local_1038;
              fVar66 = fStack_1034;
              fVar67 = fStack_1030;
              fVar68 = fStack_102c;
              fVar71 = local_1048;
              fVar76 = fStack_1044;
              fVar79 = fStack_1040;
              fVar82 = fStack_103c;
              fVar97 = local_1068;
              fVar100 = fStack_1064;
              fVar101 = fStack_1060;
              fVar102 = fStack_105c;
              goto LAB_00e6ef75;
            }
            bVar7 = false;
          }
          if (bVar7) {
            if (unaff_R15 == 0) {
              iVar19 = 4;
            }
            else {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              lVar5 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              iVar19 = 0;
              uVar11 = *(ulong *)(uVar10 + lVar5 * 8);
              uVar13 = unaff_R15 - 1 & unaff_R15;
              if (uVar13 != 0) {
                uVar23 = *(uint *)(local_1098 + lVar5 * 4);
                lVar5 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar10 + lVar5 * 8);
                uVar42 = *(uint *)(local_1098 + lVar5 * 4);
                uVar13 = uVar13 - 1 & uVar13;
                if (uVar13 == 0) {
                  if (uVar23 < uVar42) {
                    *(ulong *)*pauVar17 = uVar3;
                    *(uint *)((long)*pauVar17 + 8) = uVar42;
                    pauVar17 = pauVar17 + 1;
                  }
                  else {
                    *(ulong *)*pauVar17 = uVar11;
                    *(uint *)((long)*pauVar17 + 8) = uVar23;
                    uVar11 = uVar3;
                    pauVar17 = pauVar17 + 1;
                  }
                }
                else {
                  auVar52._8_4_ = uVar23;
                  auVar52._0_8_ = uVar11;
                  auVar52._12_4_ = 0;
                  auVar72._8_4_ = uVar42;
                  auVar72._0_8_ = uVar3;
                  auVar72._12_4_ = 0;
                  lVar5 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                    }
                  }
                  uVar4 = *(undefined8 *)(uVar10 + lVar5 * 8);
                  iVar9 = *(int *)(local_1098 + lVar5 * 4);
                  auVar65._8_4_ = iVar9;
                  auVar65._0_8_ = uVar4;
                  auVar65._12_4_ = 0;
                  auVar32._8_4_ = -(uint)((int)uVar23 < (int)uVar42);
                  uVar13 = uVar13 - 1 & uVar13;
                  if (uVar13 == 0) {
                    auVar32._4_4_ = auVar32._8_4_;
                    auVar32._0_4_ = auVar32._8_4_;
                    auVar32._12_4_ = auVar32._8_4_;
                    auVar84._8_4_ = uVar42;
                    auVar84._0_8_ = uVar3;
                    auVar84._12_4_ = 0;
                    auVar25 = blendvps(auVar84,auVar52,auVar32);
                    auVar63 = blendvps(auVar52,auVar72,auVar32);
                    auVar33._8_4_ = -(uint)(auVar25._8_4_ < iVar9);
                    auVar33._4_4_ = auVar33._8_4_;
                    auVar33._0_4_ = auVar33._8_4_;
                    auVar33._12_4_ = auVar33._8_4_;
                    auVar73._8_4_ = iVar9;
                    auVar73._0_8_ = uVar4;
                    auVar73._12_4_ = 0;
                    auVar96 = blendvps(auVar73,auVar25,auVar33);
                    auVar85 = blendvps(auVar25,auVar65,auVar33);
                    auVar34._8_4_ = -(uint)(auVar63._8_4_ < auVar85._8_4_);
                    auVar34._4_4_ = auVar34._8_4_;
                    auVar34._0_4_ = auVar34._8_4_;
                    auVar34._12_4_ = auVar34._8_4_;
                    auVar25 = blendvps(auVar85,auVar63,auVar34);
                    auVar63 = blendvps(auVar63,auVar85,auVar34);
                    *pauVar17 = auVar63;
                    pauVar17[1] = auVar25;
                    uVar11 = auVar96._0_8_;
                    pauVar17 = pauVar17 + 2;
                  }
                  else {
                    lVar5 = 0;
                    if (uVar13 != 0) {
                      for (; (uVar13 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                      }
                    }
                    auVar35._4_4_ = auVar32._8_4_;
                    auVar35._0_4_ = auVar32._8_4_;
                    auVar35._8_4_ = auVar32._8_4_;
                    auVar35._12_4_ = auVar32._8_4_;
                    auVar85 = blendvps(auVar72,auVar52,auVar35);
                    auVar63 = blendvps(auVar52,auVar72,auVar35);
                    auVar91._8_4_ = *(int *)(local_1098 + lVar5 * 4);
                    auVar91._0_8_ = *(undefined8 *)(uVar10 + lVar5 * 8);
                    auVar91._12_4_ = 0;
                    auVar36._8_4_ = -(uint)(iVar9 < *(int *)(local_1098 + lVar5 * 4));
                    auVar36._4_4_ = auVar36._8_4_;
                    auVar36._0_4_ = auVar36._8_4_;
                    auVar36._12_4_ = auVar36._8_4_;
                    auVar96 = blendvps(auVar91,auVar65,auVar36);
                    auVar25 = blendvps(auVar65,auVar91,auVar36);
                    auVar37._8_4_ = -(uint)(auVar63._8_4_ < auVar25._8_4_);
                    auVar37._4_4_ = auVar37._8_4_;
                    auVar37._0_4_ = auVar37._8_4_;
                    auVar37._12_4_ = auVar37._8_4_;
                    auVar92 = blendvps(auVar25,auVar63,auVar37);
                    auVar63 = blendvps(auVar63,auVar25,auVar37);
                    auVar38._8_4_ = -(uint)(auVar85._8_4_ < auVar96._8_4_);
                    auVar38._4_4_ = auVar38._8_4_;
                    auVar38._0_4_ = auVar38._8_4_;
                    auVar38._12_4_ = auVar38._8_4_;
                    auVar25 = blendvps(auVar96,auVar85,auVar38);
                    auVar85 = blendvps(auVar85,auVar96,auVar38);
                    auVar39._8_4_ = -(uint)(auVar85._8_4_ < auVar92._8_4_);
                    auVar39._4_4_ = auVar39._8_4_;
                    auVar39._0_4_ = auVar39._8_4_;
                    auVar39._12_4_ = auVar39._8_4_;
                    auVar96 = blendvps(auVar92,auVar85,auVar39);
                    auVar85 = blendvps(auVar85,auVar92,auVar39);
                    *pauVar17 = auVar63;
                    pauVar17[1] = auVar85;
                    pauVar17[2] = auVar96;
                    uVar11 = auVar25._0_8_;
                    pauVar17 = pauVar17 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar19 = 6;
          }
        } while (iVar19 == 0);
        if (iVar19 == 6) {
          (**(code **)((long)local_1078->leafIntersector +
                      (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1070);
          fVar40 = (ray->super_RayK<1>).tfar;
          uVar15 = local_1080;
          fVar20 = fVar40;
          fVar21 = fVar40;
          fVar43 = fVar40;
          auVar24 = local_1018;
          fVar86 = local_1058;
          fVar93 = fStack_1054;
          fVar94 = fStack_1050;
          fVar106 = fStack_104c;
          fVar50 = local_1028;
          fVar55 = fStack_1024;
          fVar58 = fStack_1020;
          fVar61 = fStack_101c;
          fVar107 = local_fc8;
          fVar108 = fStack_fc4;
          fVar109 = fStack_fc0;
          fVar110 = fStack_fbc;
          fVar62 = local_1038;
          fVar66 = fStack_1034;
          fVar67 = fStack_1030;
          fVar68 = fStack_102c;
          fVar71 = local_1048;
          fVar76 = fStack_1044;
          fVar79 = fStack_1040;
          fVar82 = fStack_103c;
          fVar97 = local_1068;
          fVar100 = fStack_1064;
          fVar101 = fStack_1060;
          fVar102 = fStack_105c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }